

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O2

void __thiscall MyEntity::MyEntity(MyEntity *this,string *name)

{
  SignalPtr<double,_int> *this_00;
  SignalTimeDependent<double,_int> *this_01;
  undefined1 local_e0 [32];
  SignalArray<int> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  dynamicgraph::Entity::Entity(&this->super_Entity,(string *)name);
  *(undefined ***)this = &PTR__MyEntity_001289c8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 "MyEntity(",name);
  std::operator+(&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 ")::input(double)::in_double");
  this_00 = &this->m_sigdSIN;
  dynamicgraph::SignalPtr<double,_int>::SignalPtr(this_00,(Signal<double,_int> *)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_c0);
  local_e0._8_8_ = update;
  local_e0._16_8_ = 0;
  local_e0._0_8_ =
       boost::function2<double&,double&,int>::
       assign_to<boost::_bi::bind_t<double&,boost::_mfi::mf2<double&,MyEntity,double&,int_const&>,boost::_bi::list3<boost::_bi::value<MyEntity*>,boost::arg<1>,boost::arg<2>>>>(boost::_bi::bind_t<double&,boost::_mfi::mf2<double&,MyEntity,double&,int_const&>,boost::_bi::list3<boost::_bi::value<MyEntity*>,boost::arg<int>,boost::arg<int>>>)
       ::stored_vtable + 1;
  local_e0._24_8_ = this;
  dynamicgraph::SignalArray_const<int>::SignalArray_const
            (&local_c0.super_SignalArray_const<int>,
             (SignalBase<int> *)
             ((long)&this_00->_vptr_SignalPtr + (long)(this->m_sigdSIN)._vptr_SignalPtr[-3]));
  std::operator+(&local_80,"MyEntity(",name);
  std::operator+(&local_60,&local_80,")::input(double)::out_double");
  this_01 = &this->m_sigdTimeDepSOUT;
  dynamicgraph::SignalTimeDependent<double,_int>::SignalTimeDependent
            (this_01,(function2<double_&,_double_&,_int> *)local_e0,
             &local_c0.super_SignalArray_const<int>,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  dynamicgraph::SignalArray_const<int>::~SignalArray_const(&local_c0.super_SignalArray_const<int>);
  boost::function2<double_&,_double_&,_int>::~function2
            ((function2<double_&,_double_&,_int> *)local_e0);
  dynamicgraph::operator<<
            (&local_c0,
             (SignalBase<int> *)
             ((long)&this_00->_vptr_SignalPtr + (long)this_00->_vptr_SignalPtr[-3]),
             (SignalBase<int> *)
             ((long)&(this_01->super_TimeDependency<int>)._vptr_TimeDependency +
             (long)(this_01->super_TimeDependency<int>)._vptr_TimeDependency[-3]));
  dynamicgraph::Entity::signalRegistration((SignalArray *)this);
  dynamicgraph::SignalArray<int>::~SignalArray(&local_c0);
  return;
}

Assistant:

explicit MyEntity(const std::string &name)
      : Entity(name),
        m_sigdSIN(NULL, "MyEntity(" + name + ")::input(double)::in_double"),
        m_sigdTimeDepSOUT(boost::bind(&MyEntity::update, this, _1, _2),
                          m_sigdSIN,
                          "MyEntity(" + name + ")::input(double)::out_double") {
    signalRegistration(m_sigdSIN << m_sigdTimeDepSOUT);
  }